

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localizer.cpp
# Opt level: O3

CameraPosition * ary::matrixToPosition(CameraPosition *__return_storage_ptr__,Matx44f *matrix)

{
  size_t sVar1;
  _OutputArray *p_Var2;
  Mat rotation;
  _OutputArray local_b0;
  _InputArray local_98;
  Mat local_80;
  
  (__return_storage_ptr__->rotation).val[0] = 0.0;
  (__return_storage_ptr__->rotation).val[1] = 0.0;
  (__return_storage_ptr__->rotation).val[2] = 0.0;
  cv::Mat::Mat(&local_80,3,3,5);
  *(float *)local_80.data = matrix->val[0];
  *(float *)((long)local_80.data + 4) = matrix->val[1];
  *(float *)((long)local_80.data + 8) = matrix->val[2];
  sVar1 = *local_80.step.p;
  *(float *)((long)local_80.data + sVar1) = matrix->val[4];
  *(float *)((long)local_80.data + sVar1 + 4) = matrix->val[5];
  *(float *)((long)local_80.data + sVar1 + 8) = matrix->val[6];
  *(float *)((long)local_80.data + sVar1 * 2) = matrix->val[8];
  *(float *)((long)local_80.data + sVar1 * 2 + 4) = matrix->val[9];
  *(float *)((long)local_80.data + sVar1 * 2 + 8) = matrix->val[10];
  (__return_storage_ptr__->translation).val[0] = matrix->val[3];
  (__return_storage_ptr__->translation).val[1] = matrix->val[7];
  (__return_storage_ptr__->translation).val[2] = matrix->val[0xb];
  local_98.sz.width = 0;
  local_98.sz.height = 0;
  local_98.flags = 0x1010000;
  local_b0.super__InputArray.flags = -0x3dfdfffb;
  local_b0.super__InputArray.sz.width = 1;
  local_b0.super__InputArray.sz.height = 3;
  local_b0.super__InputArray.obj = __return_storage_ptr__;
  local_98.obj = &local_80;
  p_Var2 = (_OutputArray *)cv::noArray();
  cv::Rodrigues(&local_98,&local_b0,p_Var2);
  cv::Mat::~Mat(&local_80);
  return __return_storage_ptr__;
}

Assistant:

CameraPosition matrixToPosition(const Matx44f& matrix) {

    CameraPosition position;

    Mat rotation(3, 3, CV_32FC1);

    rotation.at<float>(0, 0) = matrix(0, 0);
    rotation.at<float>(0, 1) = matrix(0, 1);
    rotation.at<float>(0, 2) = matrix(0, 2);

    rotation.at<float>(1, 0) = matrix(1, 0);
    rotation.at<float>(1, 1) = matrix(1, 1);
    rotation.at<float>(1, 2) = matrix(1, 2);

    rotation.at<float>(2, 0) = matrix(2, 0);
    rotation.at<float>(2, 1) = matrix(2, 1);
    rotation.at<float>(2, 2) = matrix(2, 2);

    position.translation(0) = matrix(0, 3);
    position.translation(1) = matrix(1, 3);
    position.translation(2) = matrix(2, 3);

    cv::Rodrigues(rotation, position.rotation);

    return position;
}